

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O3

void __thiscall wabt::anon_unknown_1::BinaryWriterSpec::WriteVar(BinaryWriterSpec *this,Var *var)

{
  string_view s;
  
  if (var->type_ == Name) {
    s._M_str = (var->field_2).name_._M_dataplus._M_p;
    s._M_len = (var->field_2).name_._M_string_length;
    WriteEscapedString(this,s);
    return;
  }
  if (var->type_ == Index) {
    Stream::Writef(this->json_stream_,"\"%u\"",(ulong)(var->field_2).index_);
    return;
  }
  __assert_fail("is_name()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/ir.h"
                ,0x3f,"const std::string &wabt::Var::name() const");
}

Assistant:

Index index() const {
    assert(is_index());
    return index_;
  }